

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O2

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::WeakReferenceHashTable
          (WeakReferenceHashTable<PrimePolicy> *this,uint size,HeapAllocator *allocator)

{
  uint uVar1;
  HeapAllocator *this_00;
  RecyclerWeakReferenceBase **ppRVar2;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  this->allocator = allocator;
  this->count = 0;
  this->size = 0;
  this->freeList = (RecyclerWeakReferenceBase *)0x0;
  this->modFunctionIndex = 0x4b;
  uVar1 = PrimePolicy::GetPrime(size,&this->modFunctionIndex);
  this->size = uVar1;
  data.plusSize = (size_t)uVar1;
  local_40 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136151;
  data.filename._0_4_ = 0x7f;
  this_00 = HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_40);
  ppRVar2 = AllocateArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*,false>
                      ((Memory *)this_00,(HeapAllocator *)HeapAllocator::AllocZero,0,
                       (ulong)this->size);
  this->buckets = ppRVar2;
  return;
}

Assistant:

WeakReferenceHashTable(uint size, HeapAllocator* allocator):
        count(0),
        size(0),
        modFunctionIndex(UNKNOWN_MOD_INDEX),
        allocator(allocator),
        freeList(nullptr)
    {
        this->size = SizePolicy::GetSize(size, &modFunctionIndex);
        buckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, this->size);
    }